

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::Clara::Parser::parseIntoTokens
          (Parser *this,int argc,char **argv,
          vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *tokens)

{
  char *pcVar1;
  bool local_99;
  allocator local_81;
  string local_80 [32];
  int local_60;
  int i;
  allocator local_49;
  string local_48 [8];
  string doubleDash;
  vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *tokens_local;
  char **argv_local;
  int argc_local;
  Parser *this_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"--",&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  local_60 = 1;
  while( true ) {
    local_99 = false;
    if (local_60 < argc) {
      local_99 = std::operator!=(argv[local_60],
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_48);
    }
    if (local_99 == false) break;
    pcVar1 = argv[local_60];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,pcVar1,&local_81);
    parseIntoTokens(this,(string *)local_80,tokens);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    local_60 = local_60 + 1;
  }
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void parseIntoTokens( int argc, char const * const * argv, std::vector<Parser::Token>& tokens ) const {
            const std::string doubleDash = "--";
            for( int i = 1; i < argc && argv[i] != doubleDash; ++i )
                parseIntoTokens( argv[i] , tokens);
        }